

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O2

void __thiscall RVO::KdTree::~KdTree(KdTree *this)

{
  deleteObstacleTree(this,this->obstacleTree_);
  std::_Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
  ~_Vector_base(&(this->agentTree_).
                 super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               );
  std::_Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::~_Vector_base
            ((_Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *)this);
  return;
}

Assistant:

KdTree::~KdTree()
	{
		deleteObstacleTree(obstacleTree_);
	}